

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *pNtk,int fDuplicate)

{
  void *Entry;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *p;
  char *pcVar11;
  char *__s2;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int i;
  int iVar17;
  int local_60;
  int local_5c;
  int local_4c;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x43d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
  }
  uVar4 = Abc_NtkLevel(pNtk);
  for (iVar14 = 0; iVar14 < pNtk->vCos->nSize; iVar14 = iVar14 + 1) {
    pAVar7 = Abc_NtkCo(pNtk,iVar14);
    pAVar10 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
    iVar5 = Abc_NodeIsConst(pAVar10);
    if (iVar5 != 0) {
      uVar12 = *(uint *)&pAVar7->field_0x14;
      uVar6 = Abc_NodeIsConst0(pAVar10);
      if ((uVar12 >> 10 & 1) == uVar6) {
        pAVar8 = Abc_NtkCreateNodeConst1(pNtk);
      }
      else {
        pAVar8 = Abc_NtkCreateNodeConst0(pNtk);
      }
      if ((*(uint *)&pAVar7->field_0x14 >> 10 & 1) != 0) {
        *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfffffbff;
      }
      Abc_ObjPatchFanin(pAVar7,pAVar10,pAVar8);
      if ((pAVar10->vFanouts).nSize == 0) {
        Abc_NtkDeleteObj(pAVar10);
      }
    }
  }
  pVVar9 = Vec_PtrAlloc(100);
  Abc_NtkIncrementTravId(pNtk);
  for (iVar14 = 0; iVar14 < pNtk->vCos->nSize; iVar14 = iVar14 + 1) {
    pAVar10 = Abc_NtkCo(pNtk,iVar14);
    if ((pAVar10->field_0x15 & 4) != 0) {
      pAVar10 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray];
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar10);
      if (iVar5 == 0) {
        Abc_NodeSetTravIdCurrent(pAVar10);
        Vec_PtrPush(pVVar9,pAVar10);
      }
    }
  }
  iVar14 = pVVar9->nSize;
  local_60 = 0;
  if (0 < iVar14) {
    p = Vec_PtrAlloc(100);
    local_4c = 0;
    local_60 = 0;
    for (iVar5 = 0; iVar5 != iVar14; iVar5 = iVar5 + 1) {
      pAVar10 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar5);
      uVar12 = (pAVar10->vFanouts).nSize;
      uVar15 = 0;
      uVar13 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar13 = uVar15;
      }
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        uVar12 = *(uint *)((long)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanouts).pArray[uVar15]] +
                          0x14);
        if ((uVar12 & 0xf) - 5 < 0xfffffffe) {
          bVar3 = true;
          if ((uVar12 >> 10 & 1) != 0) {
            __assert_fail("!Abc_ObjFaninC0(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x468,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
        else if ((uVar12 >> 10 & 1) == 0) {
          bVar2 = true;
        }
        else {
          bVar1 = true;
        }
      }
      if (!bVar1) {
        __assert_fail("fHasInv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                      ,0x471,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
      }
      uVar12 = *(uint *)&pAVar10->field_0x14 & 0xf;
      if ((((bVar2) || (uVar12 == 2)) || (uVar12 == 5)) ||
         ((bVar3 && (pNtk->ntkFunc == ABC_FUNC_MAP)))) {
        if ((fDuplicate == 0) || (*(uint *)&pAVar10->field_0x14 >> 0xc != uVar4 || uVar12 != 7)) {
          pAVar7 = Abc_NtkCreateNodeInv(pNtk,pAVar10);
          local_60 = local_60 + 1;
        }
        else {
          pAVar7 = Abc_NtkDupObj(pNtk,pAVar10,0);
          for (lVar16 = 0; lVar16 < (pAVar10->vFanins).nSize; lVar16 = lVar16 + 1) {
            Abc_ObjAddFanin(pAVar7,(Abc_Obj_t *)
                                   pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar16]]);
          }
          Abc_NodeComplement(pAVar7);
          local_4c = local_4c + 1;
        }
        p->nSize = 0;
        for (lVar16 = 0; lVar16 < (pAVar10->vFanouts).nSize; lVar16 = lVar16 + 1) {
          Entry = pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanouts).pArray[lVar16]];
          uVar12 = *(uint *)((long)Entry + 0x14);
          if (((uVar12 >> 10 & 1) != 0) && (0xfffffffd < (uVar12 & 0xf) - 5)) {
            Vec_PtrPush(p,Entry);
          }
        }
        iVar17 = p->nSize;
        if (iVar17 < 1) {
          __assert_fail("Vec_PtrSize(vFanouts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x487,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        for (i = 0; iVar17 != i; i = i + 1) {
          pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
          pAVar8->field_0x15 = pAVar8->field_0x15 ^ 4;
          Abc_ObjPatchFanin(pAVar8,pAVar10,pAVar7);
          uVar12 = *(uint *)&pAVar10->field_0x14 & 0xf;
          if (((uVar12 != 2) && (uVar12 != 5)) && ((pAVar10->vFanouts).nSize < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x48c,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
      }
      else {
        if (uVar12 != 7) {
          __assert_fail("Abc_ObjIsNode(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x492,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        Abc_NodeComplement(pAVar10);
        for (lVar16 = 0; lVar16 < (pAVar10->vFanouts).nSize; lVar16 = lVar16 + 1) {
          pAVar7 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanouts).pArray[lVar16]];
          uVar12 = *(uint *)&pAVar7->field_0x14;
          if ((uVar12 & 0xf) - 5 < 0xfffffffe) {
            if ((uVar12 & 0xf) != 7) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                            ,0x49d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
            }
            Abc_NodeComplementInput(pAVar7,pAVar10);
          }
          else {
            if ((uVar12 >> 10 & 1) == 0) {
              __assert_fail("Abc_ObjFaninC0(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                            ,0x498,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
            }
            *(uint *)&pAVar7->field_0x14 = uVar12 & 0xfffffbff;
          }
        }
      }
    }
    Vec_PtrFree(p);
    local_60 = local_60 + local_4c;
  }
  iVar14 = 0;
  Vec_PtrFree(pVVar9);
  pVVar9 = Vec_PtrAlloc(100);
  Abc_NtkIncrementTravId(pNtk);
  do {
    if (pNtk->vCos->nSize <= iVar14) {
      iVar14 = pVVar9->nSize;
      if (0 < iVar14) {
        iVar5 = 0;
        local_5c = 0;
        for (iVar17 = 0; iVar17 != iVar14; iVar17 = iVar17 + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar17);
          pAVar10 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          if (((fDuplicate == 0) || ((*(uint *)&pAVar10->field_0x14 & 0xf) != 7)) ||
             ((pNtk->ntkFunc != ABC_FUNC_MAP && (*(uint *)&pAVar10->field_0x14 >> 0xc != uVar4)))) {
            pAVar8 = Abc_NtkCreateNodeBuf(pNtk,pAVar10);
            pcVar11 = Abc_ObjName(pAVar10);
            Abc_ObjAssignName(pAVar8,pcVar11,"_buf");
            iVar5 = iVar5 + 1;
          }
          else {
            pAVar8 = Abc_NtkDupObj(pNtk,pAVar10,0);
            for (lVar16 = 0; lVar16 < (pAVar10->vFanins).nSize; lVar16 = lVar16 + 1) {
              Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)
                                     pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanins).pArray[lVar16]]
                             );
            }
            local_5c = local_5c + 1;
          }
          Abc_ObjPatchFanin(pAVar7,pAVar10,pAVar8);
          uVar12 = *(uint *)&pAVar10->field_0x14 & 0xf;
          if (((uVar12 != 2) && (uVar12 != 5)) && ((pAVar10->vFanouts).nSize < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x4e0,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
        local_60 = iVar5 + local_60 + local_5c;
      }
      Vec_PtrFree(pVVar9);
      return local_60;
    }
    pAVar7 = Abc_NtkCo(pNtk,iVar14);
    pAVar10 = (Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
    uVar12 = *(uint *)&pAVar10->field_0x14 & 0xf;
    if ((uVar12 == 5) || (uVar12 == 2)) {
      pcVar11 = Abc_ObjName(pAVar10);
      __s2 = Abc_ObjName(pAVar7);
      iVar5 = strcmp(pcVar11,__s2);
      if (iVar5 == 0) goto LAB_006cde56;
LAB_006cde7d:
      Vec_PtrPush(pVVar9,pAVar7);
    }
    else {
LAB_006cde56:
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar10);
      if (iVar5 == 0) {
        pAVar7 = (Abc_Obj_t *)Abc_ObjName(pAVar7);
        pAVar10->pNext = pAVar7;
        Abc_NodeSetTravIdCurrent(pAVar10);
      }
      else {
        pAVar10 = pAVar10->pNext;
        pcVar11 = Abc_ObjName(pAVar7);
        iVar5 = strcmp((char *)pAVar10,pcVar11);
        if (iVar5 != 0) goto LAB_006cde7d;
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

int Abc_NtkLogicMakeSimpleCos( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int fAddBuffers = 1;
    Vec_Ptr_t * vDrivers, * vCoTerms;
    Abc_Obj_t * pNode, * pDriver, * pDriverNew, * pFanin;
    int i, k, LevelMax, nTotal = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    LevelMax = Abc_NtkLevel(pNtk);
//    Abc_NtkLogicMakeSimpleCosTest( pNtk, fDuplicate );

    // fix constant drivers
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( !Abc_NodeIsConst(pDriver) )
            continue;
        pDriverNew = (Abc_ObjFaninC0(pNode) == Abc_NodeIsConst0(pDriver)) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
        if ( Abc_ObjFaninC0(pNode) )
            Abc_ObjXorFaninC( pNode, 0 );
        Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
        if ( Abc_ObjFanoutNum(pDriver) == 0 )
            Abc_NtkDeleteObj( pDriver );
    }

    // collect drivers pointed by complemented edges
    vDrivers = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( !Abc_ObjFaninC0(pNode) )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdCurrent(pDriver) )
            continue;
        Abc_NodeSetTravIdCurrent(pDriver);
        Vec_PtrPush( vDrivers, pDriver );
    }
    // fix complemented drivers
    if ( Vec_PtrSize(vDrivers) > 0 )
    {
        int nDupGates = 0, nDupInvs = 0, nDupChange = 0;
        Vec_Ptr_t * vFanouts = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pDriver, i )
        {
            int fHasDir = 0, fHasInv = 0, fHasOther = 0;
            Abc_ObjForEachFanout( pDriver, pNode, k )
            {
                if ( !Abc_ObjIsCo(pNode) )
                {
                    assert( !Abc_ObjFaninC0(pNode) );
                    fHasOther = 1;
                    continue;
                }
                if ( Abc_ObjFaninC0(pNode) )
                    fHasInv = 1;
                else //if ( Abc_ObjFaninC0(pNode) )
                    fHasDir = 1;
            }
            assert( fHasInv );
            if ( Abc_ObjIsCi(pDriver) || fHasDir || (fHasOther && Abc_NtkHasMapping(pNtk)) ) // cannot change
            {
                // duplicate if critical
                if ( fDuplicate && Abc_ObjIsNode(pDriver) && Abc_ObjLevel(pDriver) == LevelMax )
                {
                    pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                    Abc_ObjForEachFanin( pDriver, pFanin, k )
                        Abc_ObjAddFanin( pDriverNew, pFanin );
                    Abc_NodeComplement( pDriverNew );
                    nDupGates++;
                }
                else // add inverter
                {
                    pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
                    nDupInvs++;
                }
                // collect CO fanouts to be redirected to the new node
                Vec_PtrClear( vFanouts );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                    if ( Abc_ObjIsCo(pNode) && Abc_ObjFaninC0(pNode) )
                        Vec_PtrPush( vFanouts, pNode );
                assert( Vec_PtrSize(vFanouts) > 0 );
                Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pNode, k )
                {
                    Abc_ObjXorFaninC( pNode, 0 );
                    Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
                    assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
                }
            }
            else // can change
            {
                // change polarity of the driver
                assert( Abc_ObjIsNode(pDriver) );
                Abc_NodeComplement( pDriver );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                {
                    if ( Abc_ObjIsCo(pNode) )
                    {
                        assert( Abc_ObjFaninC0(pNode) );
                        Abc_ObjXorFaninC( pNode, 0 );
                    }
                    else if ( Abc_ObjIsNode(pNode) )
                        Abc_NodeComplementInput( pNode, pDriver );
                    else assert( 0 );
                }
                nDupChange++;
            }
        }
        Vec_PtrFree( vFanouts );
//        printf( "Resolving inverted CO drivers: Invs = %d. Dups = %d. Changes = %d.\n",
//            nDupInvs, nDupGates, nDupChange );
        nTotal += nDupInvs + nDupGates;
    }
    Vec_PtrFree( vDrivers );

    // collect COs that needs fixing by adding buffers or duplicating
    vCoTerms = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    
    // The following cases should be addressed only if the network is written 
    // into a BLIF file. Otherwise, it is possible to skip them:
    // (1) if a CO points to a CI with a different name
    // (2) if an internal node drives more than one CO
    if ( fAddBuffers )
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // if the driver is a CI and has different name, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
    }
    // fix duplication problem
    if ( Vec_PtrSize(vCoTerms) > 0 )
    {
        int nDupBufs = 0, nDupGates = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vCoTerms, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            // duplicate if critical
            if ( fDuplicate && Abc_ObjIsNode(pDriver) && (Abc_NtkHasMapping(pNtk) || Abc_ObjLevel(pDriver) == LevelMax) )
            {
                pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                Abc_ObjForEachFanin( pDriver, pFanin, k )
                    Abc_ObjAddFanin( pDriverNew, pFanin );
                nDupGates++;
            }
            else // add buffer
            {
                pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );
                Abc_ObjAssignName( pDriverNew, Abc_ObjName(pDriver), "_buf" );
                nDupBufs++;
            }
            // swing the PO
            Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
            assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
        }
//        printf( "Resolving shared CO drivers: Bufs = %d. Dups = %d.\n", nDupBufs, nDupGates );
        nTotal += nDupBufs + nDupGates;
    }
    Vec_PtrFree( vCoTerms );
    return nTotal;
}